

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O2

hbtrie_result hbtrie_last(hbtrie_iterator *it)

{
  undefined8 uVar1;
  void *pvVar2;
  long lVar3;
  hbtrie_iterator *phVar4;
  hbtrie_iterator *phVar5;
  ulong __size;
  byte bVar6;
  hbtrie_iterator temp;
  
  bVar6 = 0;
  memcpy(&temp,it,0x98);
  hbtrie_iterator_free(it);
  phVar4 = &temp;
  phVar5 = it;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined8 *)phVar4;
    (phVar5->trie).chunksize = (char)uVar1;
    (phVar5->trie).valuelen = (char)((ulong)uVar1 >> 8);
    (phVar5->trie).flag = (char)((ulong)uVar1 >> 0x10);
    (phVar5->trie).leaf_height_limit = (char)((ulong)uVar1 >> 0x18);
    (phVar5->trie).btree_nodesize = (int)((ulong)uVar1 >> 0x20);
    phVar4 = (hbtrie_iterator *)((long)phVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    phVar5 = (hbtrie_iterator *)((long)phVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  __size = (ulong)(it->trie).chunksize;
  pvVar2 = malloc(__size);
  (it->trie).last_map_chunk = pvVar2;
  memset(pvVar2,0xff,__size);
  pvVar2 = malloc(0x10000);
  it->curkey = pvVar2;
  memset(pvVar2,0xff,__size);
  it->keylen = __size;
  (it->btreeit_list).head = (list_elem *)0x0;
  (it->btreeit_list).tail = (list_elem *)0x0;
  it->flags = '\0';
  return HBTRIE_RESULT_SUCCESS;
}

Assistant:

hbtrie_result hbtrie_last(struct hbtrie_iterator *it)
{
    struct hbtrie_iterator temp;

    temp = *it;
    hbtrie_iterator_free(it);

    it->trie = temp.trie;
    // MUST NOT affect the original trie due to sharing the same memory segment
    it->trie.last_map_chunk = (void *)malloc(it->trie.chunksize);
    memset(it->trie.last_map_chunk, 0xff, it->trie.chunksize);

    it->curkey = (void *)malloc(HBTRIE_MAX_KEYLEN);
    // init with the infinite (0xff..) key without reforming
    memset(it->curkey, 0xff, it->trie.chunksize);
    it->keylen = it->trie.chunksize;

    list_init(&it->btreeit_list);
    it->flags = 0;

    return HBTRIE_RESULT_SUCCESS;
}